

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_add_output_at(wally_tx *tx,uint32_t index,wally_tx_output *output)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  wally_tx_output *pwVar4;
  wally_tx_output *p;
  _Bool is_elements;
  ulong uStack_30;
  int ret;
  uint64_t total;
  wally_tx_output *output_local;
  wally_tx *pwStack_18;
  uint32_t index_local;
  wally_tx *tx_local;
  
  bVar1 = output->features;
  total = (uint64_t)output;
  output_local._4_4_ = index;
  pwStack_18 = tx;
  _Var2 = is_valid_tx(tx);
  if ((_Var2) && ((ulong)output_local._4_4_ <= pwStack_18->num_outputs)) {
    if ((bVar1 & 1) == 0) {
      _Var2 = is_valid_tx_output((wally_tx_output *)total);
      if ((((!_Var2) ||
           (iVar3 = wally_tx_get_total_output_satoshi(pwStack_18,&stack0xffffffffffffffd0),
           iVar3 != 0)) || (uStack_30 + *(long *)total < uStack_30)) ||
         (2100000000000000 < uStack_30 + *(long *)total)) {
        return -2;
      }
    }
    else {
      _Var2 = is_valid_elements_tx_output((wally_tx_output *)total);
      if (!_Var2) {
        return -2;
      }
    }
    if (pwStack_18->outputs_allocation_len <= pwStack_18->num_outputs) {
      pwVar4 = (wally_tx_output *)
               realloc_array(pwStack_18->outputs,pwStack_18->outputs_allocation_len,
                             pwStack_18->num_outputs + 1,0x70);
      if (pwVar4 == (wally_tx_output *)0x0) {
        return -3;
      }
      clear_and_free(pwStack_18->outputs,pwStack_18->num_outputs * 0x70);
      pwStack_18->outputs = pwVar4;
      pwStack_18->outputs_allocation_len = pwStack_18->outputs_allocation_len + 1;
    }
    memmove(pwStack_18->outputs + (ulong)output_local._4_4_ + 1,
            pwStack_18->outputs + output_local._4_4_,
            (pwStack_18->num_outputs - (ulong)output_local._4_4_) * 0x70);
    tx_local._4_4_ =
         wally_tx_output_clone((wally_tx_output *)total,pwStack_18->outputs + output_local._4_4_);
    if (tx_local._4_4_ == 0) {
      pwStack_18->num_outputs = pwStack_18->num_outputs + 1;
      tx_local._4_4_ = 0;
    }
    else {
      memmove(pwStack_18->outputs + output_local._4_4_,
              pwStack_18->outputs + (ulong)output_local._4_4_ + 1,
              (pwStack_18->num_outputs - (ulong)output_local._4_4_) * 0x70);
    }
  }
  else {
    tx_local._4_4_ = -2;
  }
  return tx_local._4_4_;
}

Assistant:

int wally_tx_add_output_at(struct wally_tx *tx, uint32_t index,
                           const struct wally_tx_output *output)
{
    uint64_t total;
    int ret;
    const bool is_elements = output->features & WALLY_TX_IS_ELEMENTS;

    if (!is_valid_tx(tx) || index > tx->num_outputs)
        return WALLY_EINVAL;

    if (!is_elements) {
        if (!is_valid_tx_output(output) ||
            wally_tx_get_total_output_satoshi(tx, &total) != WALLY_OK ||
            total + output->satoshi < total || total + output->satoshi > WALLY_SATOSHI_MAX)
            return WALLY_EINVAL;
    } else if (!is_valid_elements_tx_output(output))
        return WALLY_EINVAL;

    if (tx->num_outputs >= tx->outputs_allocation_len) {
        /* Expand the outputs array */
        struct wally_tx_output *p;
        p = realloc_array(tx->outputs, tx->outputs_allocation_len,
                          tx->num_outputs + 1, sizeof(*tx->outputs));
        if (!p)
            return WALLY_ENOMEM;

        clear_and_free(tx->outputs, tx->num_outputs * sizeof(*tx->outputs));
        tx->outputs = p;
        tx->outputs_allocation_len += 1;
    }

    memmove(tx->outputs + index + 1, tx->outputs + index,
            (tx->num_outputs - index) * sizeof(*output));

    if ((ret = wally_tx_output_clone(output, tx->outputs + index)) != WALLY_OK) {
        memmove(tx->outputs + index, tx->outputs + index + 1,
                (tx->num_outputs - index) * sizeof(*output)); /* Undo */
        return ret;
    }

    tx->num_outputs += 1;
    return WALLY_OK;
}